

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Qbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int fGlucose;
  int fDumpCnf;
  int nEncVars;
  int nTimeOut;
  int nConfLimit;
  int nIterLimit;
  int nPars;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nConfLimit = -1;
  nTimeOut = 0;
  nEncVars = 0;
  fDumpCnf = 0;
  fGlucose = 0;
  bVar1 = false;
  local_48 = 0;
  local_4c = 0;
  Extra_UtilGetoptReset();
LAB_002be832:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"PICTKdgvh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"There is no current GIA.\n");
        return 1;
      }
      iVar2 = Gia_ManRegNum(pAbc->pGia);
      if (iVar2 != 0) {
        Abc_Print(-1,"Works only for combinational networks.\n");
        return 1;
      }
      iVar2 = Gia_ManPoNum(pAbc->pGia);
      if (iVar2 != 1) {
        Abc_Print(-1,"The miter should have one primary output.\n");
        return 1;
      }
      if ((0 < nConfLimit) && (iVar2 = Gia_ManPiNum(pAbc->pGia), nConfLimit < iVar2)) {
        if (bVar1) {
          Gia_QbfDumpFile(pAbc->pGia,nConfLimit);
        }
        else {
          Gia_QbfSolve(pAbc->pGia,nConfLimit,nTimeOut,nEncVars,fDumpCnf,fGlucose,local_48,local_4c);
        }
        return 0;
      }
      Abc_Print(-1,"The number of parameter variables is invalid (should be > 0 and < PI num).\n");
      return 1;
    }
    switch(iVar2) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002bebd0;
      }
      nEncVars = atoi(argv[globalUtilOptind]);
      iVar2 = nEncVars;
      break;
    default:
      goto LAB_002bebd0;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_002bebd0;
      }
      nTimeOut = atoi(argv[globalUtilOptind]);
      iVar2 = nTimeOut;
      break;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002bebd0;
      }
      fGlucose = atoi(argv[globalUtilOptind]);
      iVar2 = fGlucose;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002bebd0;
      }
      nConfLimit = atoi(argv[globalUtilOptind]);
      iVar2 = nConfLimit;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002bebd0;
      }
      fDumpCnf = atoi(argv[globalUtilOptind]);
      iVar2 = fDumpCnf;
      break;
    case 100:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002be832;
    case 0x67:
      local_48 = local_48 ^ 1;
      goto LAB_002be832;
    case 0x68:
      goto LAB_002bebd0;
    case 0x76:
      local_4c = local_4c ^ 1;
      goto LAB_002be832;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_002bebd0:
      Abc_Print(-2,"usage: &qbf [-PICTK num] [-dgvh]\n");
      Abc_Print(-2,"\t         solves QBF problem EpVxM(p,x)\n");
      Abc_Print(-2,"\t-P num : number of parameters p (should be the first PIs) [default = %d]\n",
                (ulong)(uint)nConfLimit);
      Abc_Print(-2,"\t-I num : quit after the given iteration even if unsolved [default = %d]\n",
                (ulong)(uint)nTimeOut);
      Abc_Print(-2,"\t-C num : conflict limit per problem [default = %d]\n",(ulong)(uint)nEncVars);
      Abc_Print(-2,"\t-T num : global timeout [default = %d]\n",(ulong)(uint)fDumpCnf);
      Abc_Print(-2,"\t-K num : the number of input bits (for encoding miters only) [default = %d]\n"
                ,(ulong)(uint)fGlucose);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (local_48 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (local_4c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Qbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars );
    extern int Gia_QbfSolve( Gia_Man_t * pGia, int nPars, int nIterLimit, int nConfLimit, int nTimeOut, int nEncVars, int fGlucose, int fVerbose );
    int c, nPars   = -1;
    int nIterLimit =  0;
    int nConfLimit =  0;
    int nTimeOut   =  0;
    int nEncVars   =  0;
    int fDumpCnf   =  0;
    int fGlucose   =  0;
    int fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PICTKdgvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPars < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIterLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIterLimit < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nEncVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nEncVars < 0 )
                goto usage;
            break;
        case 'd':
            fDumpCnf ^= 1;
            break;
        case 'g':
            fGlucose ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Works only for combinational networks.\n" );
        return 1;
    }
    if ( Gia_ManPoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "The miter should have one primary output.\n" );
        return 1;
    }
    if ( !(nPars > 0 && nPars < Gia_ManPiNum(pAbc->pGia)) )
    {
        Abc_Print( -1, "The number of parameter variables is invalid (should be > 0 and < PI num).\n" );
        return 1;
    }
    if ( fDumpCnf )
        Gia_QbfDumpFile( pAbc->pGia, nPars );
    else
        Gia_QbfSolve( pAbc->pGia, nPars, nIterLimit, nConfLimit, nTimeOut, nEncVars, fGlucose, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &qbf [-PICTK num] [-dgvh]\n" );
    Abc_Print( -2, "\t         solves QBF problem EpVxM(p,x)\n" );
    Abc_Print( -2, "\t-P num : number of parameters p (should be the first PIs) [default = %d]\n", nPars );
    Abc_Print( -2, "\t-I num : quit after the given iteration even if unsolved [default = %d]\n", nIterLimit );
    Abc_Print( -2, "\t-C num : conflict limit per problem [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-T num : global timeout [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-K num : the number of input bits (for encoding miters only) [default = %d]\n", nEncVars );
    Abc_Print( -2, "\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n", fDumpCnf? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", fGlucose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}